

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O0

size_t prt_light(wchar_t row,wchar_t col)

{
  loc_conflict grid;
  wchar_t wVar1;
  char *pcVar2;
  wchar_t local_18;
  wchar_t light;
  wchar_t col_local;
  wchar_t row_local;
  
  grid.x = (player->grid).x;
  grid.y = (player->grid).y;
  wVar1 = square_light((chunk *)cave,grid);
  if (wVar1 < L'\x01') {
    pcVar2 = format("Light %d ",(ulong)(uint)wVar1);
    c_put_str('\x10',pcVar2,row,col);
  }
  else {
    pcVar2 = format("Light %d ",(ulong)(uint)wVar1);
    c_put_str('\v',pcVar2,row,col);
  }
  local_18 = wVar1;
  if (wVar1 < L'\0') {
    local_18 = -wVar1;
  }
  return (long)(int)((L'\t' < local_18) + 8 + (uint)(wVar1 < L'\0'));
}

Assistant:

static size_t prt_light(int row, int col)
{
	int light = square_light(cave, player->grid);

	if (light > 0) {
		c_put_str(COLOUR_YELLOW, format("Light %d ", light), row, col);
	} else {
		c_put_str(COLOUR_PURPLE, format("Light %d ", light), row, col);
	}

	return 8 + (ABS(light) > 9 ? 1 : 0) + (light < 0 ? 1 : 0);
}